

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,int skip,aom_writer *w)

{
  MB_MODE_INFO *pMVar1;
  int iVar2;
  int iVar3;
  aom_writer *in_RCX;
  int in_EDX;
  MACROBLOCKD *in_RSI;
  AV1_COMMON *in_RDI;
  bool bVar4;
  int unaff_retaddr;
  int unaff_retaddr_00;
  MACROBLOCKD *in_stack_00000008;
  int reduced_delta_lflevel_1;
  int reduced_delta_lflevel;
  int lf_id;
  int frame_lf_count;
  int reduced_delta_qindex;
  int super_block_upper_left;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  DeltaQInfo *delta_q_info;
  int local_44;
  AV1_COMMON *cm_00;
  
  if ((in_RDI->delta_q_info).delta_q_present_flag != 0) {
    pMVar1 = *in_RSI->mi;
    bVar4 = false;
    if ((in_RSI->mi_row & in_RDI->seq_params->mib_size - 1U) == 0) {
      bVar4 = (in_RSI->mi_col & in_RDI->seq_params->mib_size - 1U) == 0;
    }
    if (((pMVar1->bsize != in_RDI->seq_params->sb_size) || (in_EDX == 0)) && (bVar4)) {
      cm_00 = in_RDI;
      write_delta_qindex(in_RSI,in_EDX,in_RCX);
      in_RSI->current_base_qindex = pMVar1->current_qindex;
      if ((in_RDI->delta_q_info).delta_lf_present_flag != 0) {
        if ((in_RDI->delta_q_info).delta_lf_multi == 0) {
          write_delta_lflevel(_reduced_delta_lflevel,in_stack_00000008,unaff_retaddr_00,
                              unaff_retaddr,(int)((ulong)cm_00 >> 0x20),(aom_writer *)in_RSI);
          in_RSI->delta_lf_from_base = pMVar1->delta_lf_from_base;
        }
        else {
          iVar2 = av1_num_planes(cm_00);
          iVar3 = 2;
          if (1 < iVar2) {
            iVar3 = 4;
          }
          for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
            write_delta_lflevel(_reduced_delta_lflevel,in_stack_00000008,unaff_retaddr_00,
                                unaff_retaddr,(int)((ulong)cm_00 >> 0x20),(aom_writer *)in_RSI);
            in_RSI->delta_lf[local_44] = pMVar1->delta_lf[local_44];
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_delta_q_params(AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, int skip,
                                        aom_writer *w) {
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    const MB_MODE_INFO *const mbmi = xd->mi[0];
    const BLOCK_SIZE bsize = mbmi->bsize;
    const int super_block_upper_left =
        ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);

    if ((bsize != cm->seq_params->sb_size || skip == 0) &&
        super_block_upper_left) {
      assert(mbmi->current_qindex > 0);
      const int reduced_delta_qindex =
          (mbmi->current_qindex - xd->current_base_qindex) /
          delta_q_info->delta_q_res;
      write_delta_qindex(xd, reduced_delta_qindex, w);
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            int reduced_delta_lflevel =
                (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                delta_q_info->delta_lf_res;
            write_delta_lflevel(cm, xd, lf_id, reduced_delta_lflevel, 1, w);
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          int reduced_delta_lflevel =
              (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
              delta_q_info->delta_lf_res;
          write_delta_lflevel(cm, xd, -1, reduced_delta_lflevel, 0, w);
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }
  }
}